

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

Vec3fa * embree::copyArrayToUSM<embree::Vec3fa>(avector<embree::Vec3fa> *in)

{
  Vec3fa *__dest;
  size_t in_RDI;
  Vec3fa *out;
  size_t in_stack_ffffffffffffffd8;
  
  __dest = (Vec3fa *)alignedUSMMalloc(in_RDI,in_stack_ffffffffffffffd8,DEFAULT);
  memcpy(__dest,*(void **)(in_RDI + 0x18),*(long *)(in_RDI + 8) << 4);
  return __dest;
}

Assistant:

Ty* copyArrayToUSM(const avector<Ty>& in) {
    Ty* out = (Ty*)alignedUSMMalloc(in.size()*sizeof(Ty));
    memcpy((void*)out,in.data(),in.size()*sizeof(Ty));
    return out;
  }